

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Scene *pSVar8;
  Ref<embree::Geometry> *pRVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  uint uVar32;
  AABBNodeMB4D *node1;
  ulong uVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  int iVar37;
  ulong uVar39;
  undefined1 (*pauVar40) [16];
  long lVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  undefined1 (*pauVar51) [16];
  ulong uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar54 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar88 [64];
  undefined1 auVar92 [16];
  uint uVar94;
  uint uVar95;
  undefined1 auVar93 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined4 uVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2950 [16];
  undefined1 (*local_2938) [16];
  ulong local_2930;
  ulong local_2928;
  long local_2920;
  ulong local_2918;
  ulong local_2910;
  long local_2908;
  ulong local_2900;
  ulong local_28f8;
  ulong local_28f0;
  ulong local_28e8;
  ulong local_28e0;
  ulong local_28d8;
  RTCFilterFunctionNArguments local_28d0;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2830 [16];
  undefined1 local_2820 [16];
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  RTCHitN local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 local_2740 [16];
  undefined4 local_2730;
  undefined4 uStack_272c;
  undefined4 uStack_2728;
  undefined4 uStack_2724;
  undefined4 local_2720;
  undefined4 uStack_271c;
  undefined4 uStack_2718;
  undefined4 uStack_2714;
  uint local_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar38;
  
  pauVar51 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_23e0._4_4_ = fVar1;
  local_23e0._0_4_ = fVar1;
  local_23e0._8_4_ = fVar1;
  local_23e0._12_4_ = fVar1;
  local_23e0._16_4_ = fVar1;
  local_23e0._20_4_ = fVar1;
  local_23e0._24_4_ = fVar1;
  local_23e0._28_4_ = fVar1;
  auVar84 = ZEXT3264(local_23e0);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2400._4_4_ = fVar2;
  local_2400._0_4_ = fVar2;
  local_2400._8_4_ = fVar2;
  local_2400._12_4_ = fVar2;
  local_2400._16_4_ = fVar2;
  local_2400._20_4_ = fVar2;
  local_2400._24_4_ = fVar2;
  local_2400._28_4_ = fVar2;
  auVar88 = ZEXT3264(local_2400);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2420._4_4_ = fVar85;
  local_2420._0_4_ = fVar85;
  local_2420._8_4_ = fVar85;
  local_2420._12_4_ = fVar85;
  local_2420._16_4_ = fVar85;
  local_2420._20_4_ = fVar85;
  local_2420._24_4_ = fVar85;
  local_2420._28_4_ = fVar85;
  auVar93 = ZEXT3264(local_2420);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar85 = fVar85 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar50 = uVar48 ^ 0x20;
  uVar52 = uVar49 ^ 0x20;
  iVar37 = (tray->tfar).field_0.i[k];
  auVar60 = ZEXT3264(CONCAT428(iVar37,CONCAT424(iVar37,CONCAT420(iVar37,CONCAT416(iVar37,CONCAT412(
                                                  iVar37,CONCAT48(iVar37,CONCAT44(iVar37,iVar37)))))
                                               )));
  local_2440._8_4_ = 0x80000000;
  local_2440._0_8_ = 0x8000000080000000;
  local_2440._12_4_ = 0x80000000;
  local_2440._16_4_ = 0x80000000;
  local_2440._20_4_ = 0x80000000;
  local_2440._24_4_ = 0x80000000;
  local_2440._28_4_ = 0x80000000;
  local_2460._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2460._8_4_ = -fVar1;
  local_2460._12_4_ = -fVar1;
  local_2460._16_4_ = -fVar1;
  local_2460._20_4_ = -fVar1;
  local_2460._24_4_ = -fVar1;
  local_2460._28_4_ = -fVar1;
  auVar97 = ZEXT3264(local_2460);
  local_2480._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2480._8_4_ = -fVar2;
  local_2480._12_4_ = -fVar2;
  local_2480._16_4_ = -fVar2;
  local_2480._20_4_ = -fVar2;
  local_2480._24_4_ = -fVar2;
  local_2480._28_4_ = -fVar2;
  auVar102 = ZEXT3264(local_2480);
  local_24a0._0_8_ = CONCAT44(fVar85,fVar85) ^ 0x8000000080000000;
  local_24a0._8_4_ = -fVar85;
  local_24a0._12_4_ = -fVar85;
  local_24a0._16_4_ = -fVar85;
  local_24a0._20_4_ = -fVar85;
  local_24a0._24_4_ = -fVar85;
  local_24a0._28_4_ = -fVar85;
  auVar105 = ZEXT3264(local_24a0);
  iVar37 = (tray->tnear).field_0.i[k];
  local_24c0._4_4_ = iVar37;
  local_24c0._0_4_ = iVar37;
  local_24c0._8_4_ = iVar37;
  local_24c0._12_4_ = iVar37;
  local_24c0._16_4_ = iVar37;
  local_24c0._20_4_ = iVar37;
  local_24c0._24_4_ = iVar37;
  local_24c0._28_4_ = iVar37;
  auVar110 = ZEXT3264(local_24c0);
  local_24e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24e0._0_16_ = mm_lookupmask_ps._0_16_;
  local_2938 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = 0x3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar57._16_4_ = 0x3f800000;
  auVar57._20_4_ = 0x3f800000;
  auVar57._24_4_ = 0x3f800000;
  auVar57._28_4_ = 0x3f800000;
  auVar83._8_4_ = 0xbf800000;
  auVar83._0_8_ = 0xbf800000bf800000;
  auVar83._12_4_ = 0xbf800000;
  auVar83._16_4_ = 0xbf800000;
  auVar83._20_4_ = 0xbf800000;
  auVar83._24_4_ = 0xbf800000;
  auVar83._28_4_ = 0xbf800000;
  local_2500 = vblendvps_avx(auVar57,auVar83,local_24e0);
  local_2930 = uVar49;
  local_2928 = uVar48;
LAB_0167f79e:
  do {
    do {
      if (pauVar51 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar40 = pauVar51 + -1;
      pauVar51 = pauVar51 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar40 + 8));
    uVar42 = *(ulong *)*pauVar51;
    while ((uVar42 & 8) == 0) {
      uVar33 = uVar42 & 0xfffffffffffffff0;
      uVar106 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar64._4_4_ = uVar106;
      auVar64._0_4_ = uVar106;
      auVar64._8_4_ = uVar106;
      auVar64._12_4_ = uVar106;
      auVar64._16_4_ = uVar106;
      auVar64._20_4_ = uVar106;
      auVar64._24_4_ = uVar106;
      auVar64._28_4_ = uVar106;
      auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar48),auVar64,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + uVar48));
      auVar61 = vfmadd213ps_fma(ZEXT1632(auVar61),auVar84._0_32_,auVar97._0_32_);
      auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar49),auVar64,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + uVar49));
      auVar66 = vfmadd213ps_fma(ZEXT1632(auVar66),auVar88._0_32_,auVar102._0_32_);
      auVar83 = vpmaxsd_avx2(ZEXT1632(auVar61),ZEXT1632(auVar66));
      auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar44),auVar64,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + uVar44));
      auVar61 = vfmadd213ps_fma(ZEXT1632(auVar61),auVar93._0_32_,auVar105._0_32_);
      auVar57 = vpmaxsd_avx2(ZEXT1632(auVar61),auVar110._0_32_);
      auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar50),auVar64,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + uVar50));
      local_26e0 = vpmaxsd_avx2(auVar83,auVar57);
      auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + uVar52),auVar64,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + uVar52));
      auVar61 = vfmadd213ps_fma(ZEXT1632(auVar61),auVar84._0_32_,auVar97._0_32_);
      auVar66 = vfmadd213ps_fma(ZEXT1632(auVar66),auVar88._0_32_,auVar102._0_32_);
      auVar83 = vpminsd_avx2(ZEXT1632(auVar61),ZEXT1632(auVar66));
      auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + (uVar44 ^ 0x20)),auVar64,
                                *(undefined1 (*) [32])(uVar33 + 0x40 + (uVar44 ^ 0x20)));
      auVar61 = vfmadd213ps_fma(ZEXT1632(auVar61),auVar93._0_32_,auVar105._0_32_);
      auVar57 = vpminsd_avx2(ZEXT1632(auVar61),auVar60._0_32_);
      auVar83 = vpminsd_avx2(auVar83,auVar57);
      auVar83 = vcmpps_avx(local_26e0,auVar83,2);
      if (((uint)uVar42 & 7) == 6) {
        auVar57 = vcmpps_avx(*(undefined1 (*) [32])(uVar33 + 0x1c0),auVar64,2);
        auVar64 = vcmpps_avx(auVar64,*(undefined1 (*) [32])(uVar33 + 0x1e0),1);
        auVar57 = vandps_avx(auVar57,auVar64);
        auVar83 = vandps_avx(auVar57,auVar83);
        auVar61 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
      }
      else {
        auVar61 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
      }
      auVar61 = vpsllw_avx(auVar61,0xf);
      if ((((((((auVar61 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar61 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar61 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar61 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar61 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar61[0xf])
      goto LAB_0167f79e;
      auVar61 = vpacksswb_avx(auVar61,auVar61);
      bVar23 = SUB161(auVar61 >> 7,0) & 1 | (SUB161(auVar61 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar61 >> 0x17,0) & 1) << 2 | (SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar61 >> 0x27,0) & 1) << 4 | (SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar61 >> 0x37,0) & 1) << 6 | SUB161(auVar61 >> 0x3f,0) << 7;
      lVar34 = 0;
      for (uVar42 = (ulong)bVar23; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
        lVar34 = lVar34 + 1;
      }
      uVar42 = *(ulong *)(uVar33 + lVar34 * 8);
      uVar36 = bVar23 - 1 & (uint)bVar23;
      uVar38 = (ulong)uVar36;
      if (uVar36 != 0) {
        uVar32 = *(uint *)(local_26e0 + lVar34 * 4);
        lVar34 = 0;
        for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
          lVar34 = lVar34 + 1;
        }
        uVar36 = uVar36 - 1 & uVar36;
        uVar39 = (ulong)uVar36;
        uVar38 = *(ulong *)(uVar33 + lVar34 * 8);
        uVar94 = *(uint *)(local_26e0 + lVar34 * 4);
        if (uVar36 == 0) {
          if (uVar32 < uVar94) {
            *(ulong *)*pauVar51 = uVar38;
            *(uint *)(*pauVar51 + 8) = uVar94;
            pauVar51 = pauVar51 + 1;
          }
          else {
            *(ulong *)*pauVar51 = uVar42;
            *(uint *)(*pauVar51 + 8) = uVar32;
            uVar42 = uVar38;
            pauVar51 = pauVar51 + 1;
          }
        }
        else {
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar42;
          auVar61 = vpunpcklqdq_avx(auVar61,ZEXT416(uVar32));
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar38;
          auVar66 = vpunpcklqdq_avx(auVar66,ZEXT416(uVar94));
          lVar34 = 0;
          for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar36 = uVar36 - 1 & uVar36;
          uVar42 = (ulong)uVar36;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = *(ulong *)(uVar33 + lVar34 * 8);
          auVar62 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_26e0 + lVar34 * 4)));
          auVar70 = vpcmpgtd_avx(auVar66,auVar61);
          if (uVar36 == 0) {
            auVar74 = vpshufd_avx(auVar70,0xaa);
            auVar70 = vblendvps_avx(auVar66,auVar61,auVar74);
            auVar61 = vblendvps_avx(auVar61,auVar66,auVar74);
            auVar66 = vpcmpgtd_avx(auVar62,auVar70);
            auVar74 = vpshufd_avx(auVar66,0xaa);
            auVar66 = vblendvps_avx(auVar62,auVar70,auVar74);
            auVar70 = vblendvps_avx(auVar70,auVar62,auVar74);
            auVar62 = vpcmpgtd_avx(auVar70,auVar61);
            auVar74 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar70,auVar61,auVar74);
            auVar61 = vblendvps_avx(auVar61,auVar70,auVar74);
            *pauVar51 = auVar61;
            pauVar51[1] = auVar62;
            uVar42 = auVar66._0_8_;
            pauVar51 = pauVar51 + 2;
          }
          else {
            lVar34 = 0;
            for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
            uVar36 = uVar36 - 1 & uVar36;
            uVar42 = (ulong)uVar36;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = *(ulong *)(uVar33 + lVar34 * 8);
            auVar74 = vpunpcklqdq_avx(auVar74,ZEXT416(*(uint *)(local_26e0 + lVar34 * 4)));
            if (uVar36 == 0) {
              auVar53 = vpshufd_avx(auVar70,0xaa);
              auVar70 = vblendvps_avx(auVar66,auVar61,auVar53);
              auVar61 = vblendvps_avx(auVar61,auVar66,auVar53);
              auVar66 = vpcmpgtd_avx(auVar74,auVar62);
              auVar53 = vpshufd_avx(auVar66,0xaa);
              auVar66 = vblendvps_avx(auVar74,auVar62,auVar53);
              auVar62 = vblendvps_avx(auVar62,auVar74,auVar53);
              auVar74 = vpcmpgtd_avx(auVar62,auVar61);
              auVar53 = vpshufd_avx(auVar74,0xaa);
              auVar74 = vblendvps_avx(auVar62,auVar61,auVar53);
              auVar61 = vblendvps_avx(auVar61,auVar62,auVar53);
              auVar62 = vpcmpgtd_avx(auVar66,auVar70);
              auVar53 = vpshufd_avx(auVar62,0xaa);
              auVar62 = vblendvps_avx(auVar66,auVar70,auVar53);
              auVar66 = vblendvps_avx(auVar70,auVar66,auVar53);
              auVar70 = vpcmpgtd_avx(auVar74,auVar66);
              auVar53 = vpshufd_avx(auVar70,0xaa);
              auVar70 = vblendvps_avx(auVar74,auVar66,auVar53);
              auVar66 = vblendvps_avx(auVar66,auVar74,auVar53);
              *pauVar51 = auVar61;
              pauVar51[1] = auVar66;
              pauVar51[2] = auVar70;
              uVar42 = auVar62._0_8_;
              pauVar51 = pauVar51 + 3;
            }
            else {
              *pauVar51 = auVar61;
              pauVar51[1] = auVar66;
              pauVar51[2] = auVar62;
              pauVar40 = pauVar51 + 3;
              pauVar51[3] = auVar74;
              do {
                lVar34 = 0;
                for (uVar38 = uVar42; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000)
                {
                  lVar34 = lVar34 + 1;
                }
                auVar62._8_8_ = 0;
                auVar62._0_8_ = *(ulong *)(uVar33 + lVar34 * 8);
                auVar61 = vpunpcklqdq_avx(auVar62,ZEXT416(*(uint *)(local_26e0 + lVar34 * 4)));
                pauVar40[1] = auVar61;
                pauVar40 = pauVar40 + 1;
                uVar42 = uVar42 - 1 & uVar42;
              } while (uVar42 != 0);
              lVar34 = 0;
              while (pauVar40 != pauVar51) {
                auVar61 = pauVar51[1];
                uVar36 = vextractps_avx(auVar61,2);
                for (lVar43 = 0x10;
                    (lVar34 != lVar43 && (*(uint *)(pauVar51[-1] + lVar43 + 8) < uVar36));
                    lVar43 = lVar43 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar51 + lVar43) =
                       *(undefined1 (*) [16])(pauVar51[-1] + lVar43);
                }
                *(undefined1 (*) [16])(*pauVar51 + lVar43) = auVar61;
                lVar34 = lVar34 + -0x10;
                pauVar51 = pauVar51 + 1;
              }
              uVar42 = *(ulong *)*pauVar40;
              pauVar51 = pauVar40;
            }
          }
        }
      }
    }
    local_2920 = (ulong)((uint)uVar42 & 0xf) - 8;
    uVar42 = uVar42 & 0xfffffffffffffff0;
    for (lVar34 = 0; lVar34 != local_2920; lVar34 = lVar34 + 1) {
      lVar35 = lVar34 * 0x60;
      pSVar8 = context->scene;
      pRVar9 = (pSVar8->geometries).items;
      pGVar10 = pRVar9[*(uint *)(uVar42 + 0x40 + lVar35)].ptr;
      fVar1 = (pGVar10->time_range).lower;
      fVar1 = pGVar10->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar10->time_range).upper - fVar1));
      auVar61 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
      auVar61 = vminss_avx(auVar61,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
      auVar63 = vmaxss_avx(ZEXT816(0) << 0x20,auVar61);
      iVar37 = (int)auVar63._0_4_;
      lVar46 = (long)iVar37 * 0x38;
      lVar43 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar46);
      local_28f0 = (ulong)*(uint *)(uVar42 + 4 + lVar35);
      auVar61 = *(undefined1 (*) [16])(lVar43 + (ulong)*(uint *)(uVar42 + lVar35) * 4);
      uVar49 = (ulong)*(uint *)(uVar42 + 0x10 + lVar35);
      auVar66 = *(undefined1 (*) [16])(lVar43 + uVar49 * 4);
      uVar33 = (ulong)*(uint *)(uVar42 + 0x20 + lVar35);
      auVar70 = *(undefined1 (*) [16])(lVar43 + uVar33 * 4);
      uVar38 = (ulong)*(uint *)(uVar42 + 0x30 + lVar35);
      auVar62 = *(undefined1 (*) [16])(lVar43 + uVar38 * 4);
      local_2908 = *(long *)&pRVar9[*(uint *)(uVar42 + 0x44 + lVar35)].ptr[2].numPrimitives;
      lVar43 = *(long *)(local_2908 + lVar46);
      auVar74 = *(undefined1 (*) [16])(lVar43 + local_28f0 * 4);
      local_28e0 = (ulong)*(uint *)(uVar42 + 0x14 + lVar35);
      auVar53 = *(undefined1 (*) [16])(lVar43 + local_28e0 * 4);
      local_28d8 = (ulong)*(uint *)(uVar42 + 0x24 + lVar35);
      auVar54 = *(undefined1 (*) [16])(lVar43 + local_28d8 * 4);
      uVar39 = (ulong)*(uint *)(uVar42 + 0x34 + lVar35);
      auVar4 = *(undefined1 (*) [16])(lVar43 + uVar39 * 4);
      lVar43 = *(long *)&pRVar9[*(uint *)(uVar42 + 0x48 + lVar35)].ptr[2].numPrimitives;
      lVar11 = *(long *)(lVar43 + lVar46);
      uVar45 = (ulong)*(uint *)(uVar42 + 8 + lVar35);
      auVar5 = *(undefined1 (*) [16])(lVar11 + uVar45 * 4);
      local_2900 = (ulong)*(uint *)(uVar42 + 0x18 + lVar35);
      auVar6 = *(undefined1 (*) [16])(lVar11 + local_2900 * 4);
      local_28f8 = (ulong)*(uint *)(uVar42 + 0x28 + lVar35);
      auVar67 = *(undefined1 (*) [16])(lVar11 + local_28f8 * 4);
      local_28e8 = (ulong)*(uint *)(uVar42 + 0x38 + lVar35);
      auVar7 = *(undefined1 (*) [16])(lVar11 + local_28e8 * 4);
      fVar1 = fVar1 - auVar63._0_4_;
      lVar11 = *(long *)&pRVar9[*(uint *)(uVar42 + 0x4c + lVar35)].ptr[2].numPrimitives;
      lVar46 = *(long *)(lVar11 + lVar46);
      uVar48 = (ulong)*(uint *)(uVar42 + 0xc + lVar35);
      auVar63 = *(undefined1 (*) [16])(lVar46 + uVar48 * 4);
      local_2918 = (ulong)*(uint *)(uVar42 + 0x1c + lVar35);
      auVar71 = *(undefined1 (*) [16])(lVar46 + local_2918 * 4);
      auVar75 = vunpcklps_avx(auVar61,auVar5);
      auVar5 = vunpckhps_avx(auVar61,auVar5);
      auVar86 = vunpcklps_avx(auVar74,auVar63);
      auVar74 = vunpckhps_avx(auVar74,auVar63);
      uVar47 = (ulong)*(uint *)(uVar42 + 0x2c + lVar35);
      auVar61 = *(undefined1 (*) [16])(lVar46 + uVar47 * 4);
      local_27c0 = vunpcklps_avx(auVar5,auVar74);
      auVar5 = vunpcklps_avx(auVar75,auVar86);
      local_27e0 = vunpckhps_avx(auVar75,auVar86);
      auVar63 = vunpcklps_avx(auVar66,auVar6);
      auVar74 = vunpckhps_avx(auVar66,auVar6);
      auVar6 = vunpcklps_avx(auVar53,auVar71);
      auVar53 = vunpckhps_avx(auVar53,auVar71);
      local_2910 = (ulong)*(uint *)(uVar42 + 0x3c + lVar35);
      auVar66 = *(undefined1 (*) [16])(lVar46 + local_2910 * 4);
      local_27b0 = vunpcklps_avx(auVar74,auVar53);
      local_27f0 = vunpcklps_avx(auVar63,auVar6);
      local_27d0 = vunpckhps_avx(auVar63,auVar6);
      auVar53 = vunpcklps_avx(auVar70,auVar67);
      auVar70 = vunpckhps_avx(auVar70,auVar67);
      auVar6 = vunpcklps_avx(auVar54,auVar61);
      auVar74 = vunpckhps_avx(auVar54,auVar61);
      lVar41 = (long)(iVar37 + 1) * 0x38;
      lVar46 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar41);
      auVar61 = *(undefined1 (*) [16])(lVar46 + (ulong)*(uint *)(uVar42 + lVar35) * 4);
      auVar54 = vunpcklps_avx(auVar70,auVar74);
      local_2820 = vunpcklps_avx(auVar53,auVar6);
      local_2800 = vunpckhps_avx(auVar53,auVar6);
      auVar74 = vunpcklps_avx(auVar62,auVar7);
      auVar70 = vunpckhps_avx(auVar62,auVar7);
      auVar53 = vunpcklps_avx(auVar4,auVar66);
      auVar62 = vunpckhps_avx(auVar4,auVar66);
      lVar43 = *(long *)(lVar43 + lVar41);
      auVar66 = *(undefined1 (*) [16])(lVar43 + uVar45 * 4);
      auVar4 = vunpcklps_avx(auVar70,auVar62);
      local_2830 = vunpcklps_avx(auVar74,auVar53);
      local_2810 = vunpckhps_avx(auVar74,auVar53);
      lVar12 = *(long *)(local_2908 + lVar41);
      auVar62 = vunpcklps_avx(auVar61,auVar66);
      auVar70 = vunpckhps_avx(auVar61,auVar66);
      auVar61 = *(undefined1 (*) [16])(lVar12 + local_28f0 * 4);
      lVar11 = *(long *)(lVar11 + lVar41);
      auVar66 = *(undefined1 (*) [16])(lVar11 + uVar48 * 4);
      auVar74 = vunpcklps_avx(auVar61,auVar66);
      auVar61 = vunpckhps_avx(auVar61,auVar66);
      auVar6 = vunpcklps_avx(auVar70,auVar61);
      auVar67 = vunpcklps_avx(auVar62,auVar74);
      auVar70 = vunpckhps_avx(auVar62,auVar74);
      auVar61 = *(undefined1 (*) [16])(lVar46 + uVar49 * 4);
      auVar66 = *(undefined1 (*) [16])(lVar43 + local_2900 * 4);
      auVar74 = vunpcklps_avx(auVar61,auVar66);
      auVar62 = vunpckhps_avx(auVar61,auVar66);
      auVar61 = *(undefined1 (*) [16])(lVar12 + local_28e0 * 4);
      auVar66 = *(undefined1 (*) [16])(lVar11 + local_2918 * 4);
      auVar53 = vunpcklps_avx(auVar61,auVar66);
      auVar61 = vunpckhps_avx(auVar61,auVar66);
      auVar7 = vunpcklps_avx(auVar62,auVar61);
      auVar63 = vunpcklps_avx(auVar74,auVar53);
      auVar62 = vunpckhps_avx(auVar74,auVar53);
      auVar61 = *(undefined1 (*) [16])(lVar46 + uVar33 * 4);
      auVar66 = *(undefined1 (*) [16])(lVar43 + local_28f8 * 4);
      auVar53 = vunpcklps_avx(auVar61,auVar66);
      auVar74 = vunpckhps_avx(auVar61,auVar66);
      auVar61 = *(undefined1 (*) [16])(lVar12 + local_28d8 * 4);
      auVar66 = *(undefined1 (*) [16])(lVar11 + uVar47 * 4);
      auVar71 = vunpcklps_avx(auVar61,auVar66);
      auVar61 = vunpckhps_avx(auVar61,auVar66);
      auVar75 = vunpcklps_avx(auVar74,auVar61);
      auVar86 = vunpcklps_avx(auVar53,auVar71);
      auVar74 = vunpckhps_avx(auVar53,auVar71);
      auVar61 = *(undefined1 (*) [16])(lVar46 + uVar38 * 4);
      auVar66 = *(undefined1 (*) [16])(lVar43 + local_28e8 * 4);
      auVar71 = vunpcklps_avx(auVar61,auVar66);
      auVar53 = vunpckhps_avx(auVar61,auVar66);
      auVar61 = *(undefined1 (*) [16])(lVar12 + uVar39 * 4);
      auVar66 = *(undefined1 (*) [16])(lVar11 + local_2910 * 4);
      auVar73 = vunpcklps_avx(auVar61,auVar66);
      auVar61 = vunpckhps_avx(auVar61,auVar66);
      auVar66 = vunpcklps_avx(auVar53,auVar61);
      auVar53 = vunpcklps_avx(auVar71,auVar73);
      auVar61 = vunpckhps_avx(auVar71,auVar73);
      fVar2 = 1.0 - fVar1;
      auVar107._4_4_ = fVar2;
      auVar107._0_4_ = fVar2;
      auVar107._8_4_ = fVar2;
      auVar107._12_4_ = fVar2;
      auVar71._0_4_ = fVar1 * auVar67._0_4_;
      auVar71._4_4_ = fVar1 * auVar67._4_4_;
      auVar71._8_4_ = fVar1 * auVar67._8_4_;
      auVar71._12_4_ = fVar1 * auVar67._12_4_;
      auVar5 = vfmadd231ps_fma(auVar71,auVar107,auVar5);
      auVar77._0_4_ = fVar1 * auVar70._0_4_;
      auVar77._4_4_ = fVar1 * auVar70._4_4_;
      auVar77._8_4_ = fVar1 * auVar70._8_4_;
      auVar77._12_4_ = fVar1 * auVar70._12_4_;
      auVar70 = vfmadd231ps_fma(auVar77,auVar107,local_27e0);
      auVar73._0_4_ = auVar6._0_4_ * fVar1;
      auVar73._4_4_ = auVar6._4_4_ * fVar1;
      auVar73._8_4_ = auVar6._8_4_ * fVar1;
      auVar73._12_4_ = auVar6._12_4_ * fVar1;
      auVar6 = vfmadd231ps_fma(auVar73,auVar107,local_27c0);
      auVar67._0_4_ = fVar1 * auVar63._0_4_;
      auVar67._4_4_ = fVar1 * auVar63._4_4_;
      auVar67._8_4_ = fVar1 * auVar63._8_4_;
      auVar67._12_4_ = fVar1 * auVar63._12_4_;
      auVar67 = vfmadd231ps_fma(auVar67,auVar107,local_27f0);
      auVar63._0_4_ = fVar1 * auVar62._0_4_;
      auVar63._4_4_ = fVar1 * auVar62._4_4_;
      auVar63._8_4_ = fVar1 * auVar62._8_4_;
      auVar63._12_4_ = fVar1 * auVar62._12_4_;
      auVar62 = vfmadd231ps_fma(auVar63,auVar107,local_27d0);
      auVar80._0_4_ = auVar7._0_4_ * fVar1;
      auVar80._4_4_ = auVar7._4_4_ * fVar1;
      auVar80._8_4_ = auVar7._8_4_ * fVar1;
      auVar80._12_4_ = auVar7._12_4_ * fVar1;
      auVar7 = vfmadd231ps_fma(auVar80,auVar107,local_27b0);
      auVar92._0_4_ = auVar86._0_4_ * fVar1;
      auVar92._4_4_ = auVar86._4_4_ * fVar1;
      auVar92._8_4_ = auVar86._8_4_ * fVar1;
      auVar92._12_4_ = auVar86._12_4_ * fVar1;
      auVar63 = vfmadd231ps_fma(auVar92,auVar107,local_2820);
      auVar98._0_4_ = auVar74._0_4_ * fVar1;
      auVar98._4_4_ = auVar74._4_4_ * fVar1;
      auVar98._8_4_ = auVar74._8_4_ * fVar1;
      auVar98._12_4_ = auVar74._12_4_ * fVar1;
      auVar74 = vfmadd231ps_fma(auVar98,auVar107,local_2800);
      auVar103._0_4_ = auVar75._0_4_ * fVar1;
      auVar103._4_4_ = auVar75._4_4_ * fVar1;
      auVar103._8_4_ = auVar75._8_4_ * fVar1;
      auVar103._12_4_ = auVar75._12_4_ * fVar1;
      auVar54 = vfmadd231ps_fma(auVar103,auVar107,auVar54);
      auVar75._0_4_ = fVar1 * auVar53._0_4_;
      auVar75._4_4_ = fVar1 * auVar53._4_4_;
      auVar75._8_4_ = fVar1 * auVar53._8_4_;
      auVar75._12_4_ = fVar1 * auVar53._12_4_;
      auVar86._0_4_ = auVar61._0_4_ * fVar1;
      auVar86._4_4_ = auVar61._4_4_ * fVar1;
      auVar86._8_4_ = auVar61._8_4_ * fVar1;
      auVar86._12_4_ = auVar61._12_4_ * fVar1;
      auVar53._0_4_ = auVar66._0_4_ * fVar1;
      auVar53._4_4_ = auVar66._4_4_ * fVar1;
      auVar53._8_4_ = auVar66._8_4_ * fVar1;
      auVar53._12_4_ = auVar66._12_4_ * fVar1;
      lVar43 = uVar42 + 0x40 + lVar35;
      local_23c0 = *(undefined8 *)(lVar43 + 0x10);
      uStack_23b8 = *(undefined8 *)(lVar43 + 0x18);
      auVar61 = vfmadd231ps_fma(auVar75,auVar107,local_2830);
      uStack_23b0 = local_23c0;
      uStack_23a8 = uStack_23b8;
      lVar35 = uVar42 + 0x50 + lVar35;
      local_27a0 = *(undefined8 *)(lVar35 + 0x10);
      uStack_2798 = *(undefined8 *)(lVar35 + 0x18);
      auVar66 = vfmadd231ps_fma(auVar86,auVar107,local_2810);
      auVar53 = vfmadd231ps_fma(auVar53,auVar107,auVar4);
      uStack_2790 = local_27a0;
      uStack_2788 = uStack_2798;
      auVar108._16_16_ = auVar63;
      auVar108._0_16_ = auVar5;
      auVar78._16_16_ = auVar74;
      auVar78._0_16_ = auVar70;
      auVar99._16_16_ = auVar54;
      auVar99._0_16_ = auVar6;
      auVar68._16_16_ = auVar67;
      auVar68._0_16_ = auVar67;
      auVar65._16_16_ = auVar62;
      auVar65._0_16_ = auVar62;
      auVar72._16_16_ = auVar7;
      auVar72._0_16_ = auVar7;
      auVar76._16_16_ = auVar61;
      auVar76._0_16_ = auVar61;
      auVar81._16_16_ = auVar66;
      auVar81._0_16_ = auVar66;
      auVar55._16_16_ = auVar53;
      auVar55._0_16_ = auVar53;
      auVar57 = vsubps_avx(auVar108,auVar68);
      auVar83 = vsubps_avx(auVar78,auVar65);
      auVar64 = vsubps_avx(auVar99,auVar72);
      auVar65 = vsubps_avx(auVar76,auVar108);
      auVar19 = vsubps_avx(auVar81,auVar78);
      auVar20 = vsubps_avx(auVar55,auVar99);
      auVar21._4_4_ = auVar83._4_4_ * auVar20._4_4_;
      auVar21._0_4_ = auVar83._0_4_ * auVar20._0_4_;
      auVar21._8_4_ = auVar83._8_4_ * auVar20._8_4_;
      auVar21._12_4_ = auVar83._12_4_ * auVar20._12_4_;
      auVar21._16_4_ = auVar83._16_4_ * auVar20._16_4_;
      auVar21._20_4_ = auVar83._20_4_ * auVar20._20_4_;
      auVar21._24_4_ = auVar83._24_4_ * auVar20._24_4_;
      auVar21._28_4_ = auVar53._12_4_;
      auVar74 = vfmsub231ps_fma(auVar21,auVar19,auVar64);
      uVar106 = *(undefined4 *)(ray + k * 4);
      auVar69._4_4_ = uVar106;
      auVar69._0_4_ = uVar106;
      auVar69._8_4_ = uVar106;
      auVar69._12_4_ = uVar106;
      auVar69._16_4_ = uVar106;
      auVar69._20_4_ = uVar106;
      auVar69._24_4_ = uVar106;
      auVar69._28_4_ = uVar106;
      uVar106 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar82._4_4_ = uVar106;
      auVar82._0_4_ = uVar106;
      auVar82._8_4_ = uVar106;
      auVar82._12_4_ = uVar106;
      auVar82._16_4_ = uVar106;
      auVar82._20_4_ = uVar106;
      auVar82._24_4_ = uVar106;
      auVar82._28_4_ = uVar106;
      uVar106 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar112._4_4_ = uVar106;
      auVar112._0_4_ = uVar106;
      auVar112._8_4_ = uVar106;
      auVar112._12_4_ = uVar106;
      auVar112._16_4_ = uVar106;
      auVar112._20_4_ = uVar106;
      auVar112._24_4_ = uVar106;
      auVar112._28_4_ = uVar106;
      fVar1 = *(float *)(ray + k * 4 + 0x40);
      auVar96._4_4_ = fVar1;
      auVar96._0_4_ = fVar1;
      auVar96._8_4_ = fVar1;
      auVar96._12_4_ = fVar1;
      auVar96._16_4_ = fVar1;
      auVar96._20_4_ = fVar1;
      auVar96._24_4_ = fVar1;
      auVar96._28_4_ = fVar1;
      auVar22._4_4_ = auVar64._4_4_ * auVar65._4_4_;
      auVar22._0_4_ = auVar64._0_4_ * auVar65._0_4_;
      auVar22._8_4_ = auVar64._8_4_ * auVar65._8_4_;
      auVar22._12_4_ = auVar64._12_4_ * auVar65._12_4_;
      auVar22._16_4_ = auVar64._16_4_ * auVar65._16_4_;
      auVar22._20_4_ = auVar64._20_4_ * auVar65._20_4_;
      auVar22._24_4_ = auVar64._24_4_ * auVar65._24_4_;
      auVar22._28_4_ = auVar62._12_4_;
      auVar21 = vsubps_avx(auVar108,auVar69);
      fVar2 = *(float *)(ray + k * 4 + 0x50);
      auVar109._4_4_ = fVar2;
      auVar109._0_4_ = fVar2;
      auVar109._8_4_ = fVar2;
      auVar109._12_4_ = fVar2;
      auVar109._16_4_ = fVar2;
      auVar109._20_4_ = fVar2;
      auVar109._24_4_ = fVar2;
      auVar109._28_4_ = fVar2;
      auVar62 = vfmsub231ps_fma(auVar22,auVar20,auVar57);
      auVar22 = vsubps_avx(auVar78,auVar82);
      fVar85 = *(float *)(ray + k * 4 + 0x60);
      auVar111._4_4_ = fVar85;
      auVar111._0_4_ = fVar85;
      auVar111._8_4_ = fVar85;
      auVar111._12_4_ = fVar85;
      auVar111._16_4_ = fVar85;
      auVar111._20_4_ = fVar85;
      auVar111._24_4_ = fVar85;
      auVar111._28_4_ = fVar85;
      auVar55 = vsubps_avx(auVar99,auVar112);
      auVar24._4_4_ = fVar1 * auVar22._4_4_;
      auVar24._0_4_ = fVar1 * auVar22._0_4_;
      auVar24._8_4_ = fVar1 * auVar22._8_4_;
      auVar24._12_4_ = fVar1 * auVar22._12_4_;
      auVar24._16_4_ = fVar1 * auVar22._16_4_;
      auVar24._20_4_ = fVar1 * auVar22._20_4_;
      auVar24._24_4_ = fVar1 * auVar22._24_4_;
      auVar24._28_4_ = auVar54._12_4_;
      auVar61 = vfmsub231ps_fma(auVar24,auVar21,auVar109);
      auVar25._4_4_ = auVar20._4_4_ * auVar61._4_4_;
      auVar25._0_4_ = auVar20._0_4_ * auVar61._0_4_;
      auVar25._8_4_ = auVar20._8_4_ * auVar61._8_4_;
      auVar25._12_4_ = auVar20._12_4_ * auVar61._12_4_;
      auVar25._16_4_ = auVar20._16_4_ * 0.0;
      auVar25._20_4_ = auVar20._20_4_ * 0.0;
      auVar25._24_4_ = auVar20._24_4_ * 0.0;
      auVar25._28_4_ = auVar20._28_4_;
      auVar100._0_4_ = auVar64._0_4_ * auVar61._0_4_;
      auVar100._4_4_ = auVar64._4_4_ * auVar61._4_4_;
      auVar100._8_4_ = auVar64._8_4_ * auVar61._8_4_;
      auVar100._12_4_ = auVar64._12_4_ * auVar61._12_4_;
      auVar100._16_4_ = auVar64._16_4_ * 0.0;
      auVar100._20_4_ = auVar64._20_4_ * 0.0;
      auVar100._24_4_ = auVar64._24_4_ * 0.0;
      auVar100._28_4_ = 0;
      auVar20._4_4_ = fVar85 * auVar21._4_4_;
      auVar20._0_4_ = fVar85 * auVar21._0_4_;
      auVar20._8_4_ = fVar85 * auVar21._8_4_;
      auVar20._12_4_ = fVar85 * auVar21._12_4_;
      auVar20._16_4_ = fVar85 * auVar21._16_4_;
      auVar20._20_4_ = fVar85 * auVar21._20_4_;
      auVar20._24_4_ = fVar85 * auVar21._24_4_;
      auVar20._28_4_ = auVar64._28_4_;
      auVar66 = vfmsub231ps_fma(auVar20,auVar55,auVar96);
      auVar61 = vfmadd231ps_fma(auVar25,ZEXT1632(auVar66),auVar19);
      auVar66 = vfmadd231ps_fma(auVar100,auVar83,ZEXT1632(auVar66));
      auVar26._4_4_ = auVar57._4_4_ * auVar19._4_4_;
      auVar26._0_4_ = auVar57._0_4_ * auVar19._0_4_;
      auVar26._8_4_ = auVar57._8_4_ * auVar19._8_4_;
      auVar26._12_4_ = auVar57._12_4_ * auVar19._12_4_;
      auVar26._16_4_ = auVar57._16_4_ * auVar19._16_4_;
      auVar26._20_4_ = auVar57._20_4_ * auVar19._20_4_;
      auVar26._24_4_ = auVar57._24_4_ * auVar19._24_4_;
      auVar26._28_4_ = auVar19._28_4_;
      auVar53 = vfmsub231ps_fma(auVar26,auVar65,auVar83);
      auVar19._4_4_ = fVar2 * auVar55._4_4_;
      auVar19._0_4_ = fVar2 * auVar55._0_4_;
      auVar19._8_4_ = fVar2 * auVar55._8_4_;
      auVar19._12_4_ = fVar2 * auVar55._12_4_;
      auVar19._16_4_ = fVar2 * auVar55._16_4_;
      auVar19._20_4_ = fVar2 * auVar55._20_4_;
      auVar19._24_4_ = fVar2 * auVar55._24_4_;
      auVar19._28_4_ = auVar83._28_4_;
      auVar54 = vfmsub231ps_fma(auVar19,auVar22,auVar111);
      fVar1 = auVar53._0_4_;
      fVar2 = auVar53._4_4_;
      auVar27._4_4_ = fVar85 * fVar2;
      auVar27._0_4_ = fVar85 * fVar1;
      fVar14 = auVar53._8_4_;
      auVar27._8_4_ = fVar85 * fVar14;
      fVar15 = auVar53._12_4_;
      auVar27._12_4_ = fVar85 * fVar15;
      auVar27._16_4_ = fVar85 * 0.0;
      auVar27._20_4_ = fVar85 * 0.0;
      auVar27._24_4_ = fVar85 * 0.0;
      auVar27._28_4_ = fVar85;
      auVar70 = vfmadd231ps_fma(auVar27,ZEXT1632(auVar62),auVar109);
      auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),ZEXT1632(auVar74),auVar96);
      auVar61 = vfmadd231ps_fma(ZEXT1632(auVar61),ZEXT1632(auVar54),auVar65);
      auVar83 = vandps_avx(ZEXT1632(auVar70),local_2440);
      uVar36 = auVar83._0_4_;
      local_26e0._0_4_ = (float)(uVar36 ^ auVar61._0_4_);
      uVar32 = auVar83._4_4_;
      local_26e0._4_4_ = (float)(uVar32 ^ auVar61._4_4_);
      uVar94 = auVar83._8_4_;
      local_26e0._8_4_ = (float)(uVar94 ^ auVar61._8_4_);
      uVar95 = auVar83._12_4_;
      local_26e0._12_4_ = (float)(uVar95 ^ auVar61._12_4_);
      local_26a0._16_4_ = auVar83._16_4_;
      local_26e0._16_4_ = local_26a0._16_4_;
      local_26a0._20_4_ = auVar83._20_4_;
      local_26e0._20_4_ = local_26a0._20_4_;
      local_26a0._24_4_ = auVar83._24_4_;
      local_26e0._24_4_ = local_26a0._24_4_;
      local_26a0._28_4_ = auVar83._28_4_;
      local_26e0._28_4_ = local_26a0._28_4_;
      auVar61 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar57,ZEXT1632(auVar54));
      local_26c0._0_4_ = (float)(uVar36 ^ auVar61._0_4_);
      local_26c0._4_4_ = (float)(uVar32 ^ auVar61._4_4_);
      local_26c0._8_4_ = (float)(uVar94 ^ auVar61._8_4_);
      local_26c0._12_4_ = (float)(uVar95 ^ auVar61._12_4_);
      local_26c0._16_4_ = local_26a0._16_4_;
      local_26c0._20_4_ = local_26a0._20_4_;
      local_26c0._24_4_ = local_26a0._24_4_;
      local_26c0._28_4_ = local_26a0._28_4_;
      auVar83 = vcmpps_avx(local_26e0,ZEXT832(0) << 0x20,5);
      auVar57 = vcmpps_avx(local_26c0,ZEXT832(0) << 0x20,5);
      auVar83 = vandps_avx(auVar83,auVar57);
      auVar87._8_4_ = 0x7fffffff;
      auVar87._0_8_ = 0x7fffffff7fffffff;
      auVar87._12_4_ = 0x7fffffff;
      auVar87._16_4_ = 0x7fffffff;
      auVar87._20_4_ = 0x7fffffff;
      auVar87._24_4_ = 0x7fffffff;
      auVar87._28_4_ = 0x7fffffff;
      local_2680 = vandps_avx(ZEXT1632(auVar70),auVar87);
      auVar57 = vcmpps_avx(ZEXT1632(auVar70),ZEXT832(0) << 0x20,4);
      auVar83 = vandps_avx(auVar83,auVar57);
      auVar101._0_4_ = local_26e0._0_4_ + local_26c0._0_4_;
      auVar101._4_4_ = local_26e0._4_4_ + local_26c0._4_4_;
      auVar101._8_4_ = local_26e0._8_4_ + local_26c0._8_4_;
      auVar101._12_4_ = local_26e0._12_4_ + local_26c0._12_4_;
      auVar101._16_4_ = local_26a0._16_4_ + local_26a0._16_4_;
      auVar101._20_4_ = local_26a0._20_4_ + local_26a0._20_4_;
      auVar101._24_4_ = local_26a0._24_4_ + local_26a0._24_4_;
      auVar101._28_4_ = local_26a0._28_4_ + local_26a0._28_4_;
      auVar57 = vcmpps_avx(auVar101,local_2680,2);
      auVar64 = auVar57 & auVar83;
      if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar64 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar64 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar64 >> 0x7f,0) != '\0') ||
            (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar64 >> 0xbf,0) != '\0') ||
          (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar64[0x1f] < '\0') {
        auVar83 = vandps_avx(auVar83,auVar57);
        auVar61 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
        auVar28._4_4_ = fVar2 * auVar55._4_4_;
        auVar28._0_4_ = fVar1 * auVar55._0_4_;
        auVar28._8_4_ = fVar14 * auVar55._8_4_;
        auVar28._12_4_ = fVar15 * auVar55._12_4_;
        auVar28._16_4_ = auVar55._16_4_ * 0.0;
        auVar28._20_4_ = auVar55._20_4_ * 0.0;
        auVar28._24_4_ = auVar55._24_4_ * 0.0;
        auVar28._28_4_ = auVar55._28_4_;
        auVar66 = vfmadd213ps_fma(auVar22,ZEXT1632(auVar62),auVar28);
        auVar66 = vfmadd213ps_fma(auVar21,ZEXT1632(auVar74),ZEXT1632(auVar66));
        local_26a0._0_4_ = (float)(uVar36 ^ auVar66._0_4_);
        local_26a0._4_4_ = (float)(uVar32 ^ auVar66._4_4_);
        local_26a0._8_4_ = (float)(uVar94 ^ auVar66._8_4_);
        local_26a0._12_4_ = (float)(uVar95 ^ auVar66._12_4_);
        fVar85 = *(float *)(ray + k * 4 + 0x30);
        auVar29._4_4_ = local_2680._4_4_ * fVar85;
        auVar29._0_4_ = local_2680._0_4_ * fVar85;
        auVar29._8_4_ = local_2680._8_4_ * fVar85;
        auVar29._12_4_ = local_2680._12_4_ * fVar85;
        auVar29._16_4_ = local_2680._16_4_ * fVar85;
        auVar29._20_4_ = local_2680._20_4_ * fVar85;
        auVar29._24_4_ = local_2680._24_4_ * fVar85;
        auVar29._28_4_ = fVar85;
        auVar83 = vcmpps_avx(auVar29,local_26a0,1);
        fVar85 = *(float *)(ray + k * 4 + 0x80);
        auVar60 = ZEXT3264(CONCAT428(fVar85,CONCAT424(fVar85,CONCAT420(fVar85,CONCAT416(fVar85,
                                                  CONCAT412(fVar85,CONCAT48(fVar85,CONCAT44(fVar85,
                                                  fVar85))))))));
        auVar79._0_4_ = local_2680._0_4_ * fVar85;
        auVar79._4_4_ = local_2680._4_4_ * fVar85;
        auVar79._8_4_ = local_2680._8_4_ * fVar85;
        auVar79._12_4_ = local_2680._12_4_ * fVar85;
        auVar79._16_4_ = local_2680._16_4_ * fVar85;
        auVar79._20_4_ = local_2680._20_4_ * fVar85;
        auVar79._24_4_ = local_2680._24_4_ * fVar85;
        auVar79._28_4_ = 0;
        auVar57 = vcmpps_avx(local_26a0,auVar79,2);
        auVar83 = vandps_avx(auVar83,auVar57);
        auVar66 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
        auVar61 = vpand_avx(auVar61,auVar66);
        auVar83 = vpmovzxwd_avx2(auVar61);
        auVar83 = vpslld_avx2(auVar83,0x1f);
        if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar83 >> 0x7f,0) != '\0') ||
              (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar83 >> 0xbf,0) != '\0') ||
            (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar83[0x1f] < '\0') {
          local_2880 = vpsrad_avx2(auVar83,0x1f);
          local_2660 = ZEXT1632(auVar74);
          local_2640 = ZEXT1632(auVar62);
          local_2620 = ZEXT1632(auVar53);
          local_2600 = local_2880;
          local_2520 = local_24e0;
          auVar57 = vrcpps_avx(local_2680);
          auVar104._8_4_ = 0x3f800000;
          auVar104._0_8_ = 0x3f8000003f800000;
          auVar104._12_4_ = 0x3f800000;
          auVar104._16_4_ = 0x3f800000;
          auVar104._20_4_ = 0x3f800000;
          auVar104._24_4_ = 0x3f800000;
          auVar104._28_4_ = 0x3f800000;
          auVar66 = vfnmadd213ps_fma(local_2680,auVar57,auVar104);
          auVar66 = vfmadd132ps_fma(ZEXT1632(auVar66),auVar57,auVar57);
          fVar85 = auVar66._0_4_;
          fVar89 = auVar66._4_4_;
          local_25a0._4_4_ = fVar89 * local_26a0._4_4_;
          local_25a0._0_4_ = fVar85 * local_26a0._0_4_;
          fVar90 = auVar66._8_4_;
          local_25a0._8_4_ = fVar90 * local_26a0._8_4_;
          fVar91 = auVar66._12_4_;
          local_25a0._12_4_ = fVar91 * local_26a0._12_4_;
          local_25a0._16_4_ = local_26a0._16_4_ * 0.0;
          local_25a0._20_4_ = local_26a0._20_4_ * 0.0;
          local_25a0._24_4_ = local_26a0._24_4_ * 0.0;
          local_25a0._28_4_ = auVar57._28_4_;
          auVar84 = ZEXT3264(local_25a0);
          auVar30._4_4_ = fVar89 * local_26e0._4_4_;
          auVar30._0_4_ = fVar85 * local_26e0._0_4_;
          auVar30._8_4_ = fVar90 * local_26e0._8_4_;
          auVar30._12_4_ = fVar91 * local_26e0._12_4_;
          auVar30._16_4_ = local_26a0._16_4_ * 0.0;
          auVar30._20_4_ = local_26a0._20_4_ * 0.0;
          auVar30._24_4_ = local_26a0._24_4_ * 0.0;
          auVar30._28_4_ = local_26a0._28_4_;
          auVar57 = vminps_avx(auVar30,auVar104);
          auVar31._4_4_ = fVar89 * local_26c0._4_4_;
          auVar31._0_4_ = fVar85 * local_26c0._0_4_;
          auVar31._8_4_ = fVar90 * local_26c0._8_4_;
          auVar31._12_4_ = fVar91 * local_26c0._12_4_;
          auVar31._16_4_ = local_26a0._16_4_ * 0.0;
          auVar31._20_4_ = local_26a0._20_4_ * 0.0;
          auVar31._24_4_ = local_26a0._24_4_ * 0.0;
          auVar31._28_4_ = local_26a0._28_4_;
          auVar64 = vminps_avx(auVar31,auVar104);
          auVar65 = vsubps_avx(auVar104,auVar57);
          auVar19 = vsubps_avx(auVar104,auVar64);
          local_25c0 = vblendvps_avx(auVar64,auVar65,local_24e0);
          local_25e0 = vblendvps_avx(auVar57,auVar19,local_24e0);
          fVar85 = local_2500._0_4_;
          local_2580._0_4_ = auVar74._0_4_ * fVar85;
          fVar89 = local_2500._4_4_;
          local_2580._4_4_ = auVar74._4_4_ * fVar89;
          fVar90 = local_2500._8_4_;
          local_2580._8_4_ = auVar74._8_4_ * fVar90;
          fVar91 = local_2500._12_4_;
          local_2580._12_4_ = auVar74._12_4_ * fVar91;
          fVar16 = local_2500._16_4_;
          local_2580._16_4_ = fVar16 * 0.0;
          fVar17 = local_2500._20_4_;
          local_2580._20_4_ = fVar17 * 0.0;
          fVar18 = local_2500._24_4_;
          local_2580._24_4_ = fVar18 * 0.0;
          local_2580._28_4_ = 0;
          local_2560._0_4_ = fVar85 * auVar62._0_4_;
          local_2560._4_4_ = fVar89 * auVar62._4_4_;
          local_2560._8_4_ = fVar90 * auVar62._8_4_;
          local_2560._12_4_ = fVar91 * auVar62._12_4_;
          local_2560._16_4_ = fVar16 * 0.0;
          local_2560._20_4_ = fVar17 * 0.0;
          local_2560._24_4_ = fVar18 * 0.0;
          local_2560._28_4_ = 0;
          local_2540._0_4_ = fVar85 * fVar1;
          local_2540._4_4_ = fVar89 * fVar2;
          local_2540._8_4_ = fVar90 * fVar14;
          local_2540._12_4_ = fVar91 * fVar15;
          local_2540._16_4_ = fVar16 * 0.0;
          local_2540._20_4_ = fVar17 * 0.0;
          local_2540._24_4_ = fVar18 * 0.0;
          local_2540._28_4_ = 0;
          auVar56._8_4_ = 0x7f800000;
          auVar56._0_8_ = 0x7f8000007f800000;
          auVar56._12_4_ = 0x7f800000;
          auVar56._16_4_ = 0x7f800000;
          auVar56._20_4_ = 0x7f800000;
          auVar56._24_4_ = 0x7f800000;
          auVar56._28_4_ = 0x7f800000;
          auVar83 = vblendvps_avx(auVar56,local_25a0,auVar83);
          auVar57 = vshufps_avx(auVar83,auVar83,0xb1);
          auVar57 = vminps_avx(auVar83,auVar57);
          auVar64 = vshufpd_avx(auVar57,auVar57,5);
          auVar57 = vminps_avx(auVar57,auVar64);
          auVar64 = vpermpd_avx2(auVar57,0x4e);
          auVar57 = vminps_avx(auVar57,auVar64);
          auVar83 = vcmpps_avx(auVar83,auVar57,0);
          auVar66 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
          auVar61 = vpand_avx(auVar66,auVar61);
          auVar83 = vpmovzxwd_avx2(auVar61);
          auVar57 = vpslld_avx2(auVar83,0x1f);
          auVar83 = local_2880;
          if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar57 >> 0x7f,0) != '\0') ||
                (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar57 >> 0xbf,0) != '\0') ||
              (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar57[0x1f] < '\0') {
            auVar83 = vpsrad_avx2(auVar57,0x1f);
          }
          auVar88 = ZEXT3264(auVar83);
LAB_016803d3:
          uVar32 = vmovmskps_avx(auVar88._0_32_);
          uVar36 = 0;
          for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
            uVar36 = uVar36 + 1;
          }
          uVar48 = (ulong)uVar36;
          local_2710 = *(uint *)((long)&local_23c0 + uVar48 * 4);
          pGVar10 = (pSVar8->geometries).items[local_2710].ptr;
          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_2880 + uVar48 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar48 = (ulong)(uVar36 << 2);
              uVar106 = *(undefined4 *)(local_25e0 + uVar48);
              uVar3 = *(undefined4 *)(local_25c0 + uVar48);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar48);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2580 + uVar48);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2560 + uVar48);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2540 + uVar48);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar106;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_27a0 + uVar48);
              *(uint *)(ray + k * 4 + 0x120) = local_2710;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              goto LAB_016801ba;
            }
            local_2860 = auVar84._0_32_;
            local_28a0 = auVar60._0_32_;
            uVar49 = (ulong)(uVar36 * 4);
            uVar106 = *(undefined4 *)(local_25e0 + uVar49);
            local_2740._4_4_ = uVar106;
            local_2740._0_4_ = uVar106;
            local_2740._8_4_ = uVar106;
            local_2740._12_4_ = uVar106;
            local_2730 = *(undefined4 *)(local_25c0 + uVar49);
            local_2720 = *(undefined4 *)((long)&local_27a0 + uVar49);
            uVar106 = *(undefined4 *)(local_2580 + uVar49);
            uVar3 = *(undefined4 *)(local_2560 + uVar49);
            local_2760._4_4_ = uVar3;
            local_2760._0_4_ = uVar3;
            local_2760._8_4_ = uVar3;
            local_2760._12_4_ = uVar3;
            uVar3 = *(undefined4 *)(local_2540 + uVar49);
            local_2750._4_4_ = uVar3;
            local_2750._0_4_ = uVar3;
            local_2750._8_4_ = uVar3;
            local_2750._12_4_ = uVar3;
            local_2770[0] = (RTCHitN)(char)uVar106;
            local_2770[1] = (RTCHitN)(char)((uint)uVar106 >> 8);
            local_2770[2] = (RTCHitN)(char)((uint)uVar106 >> 0x10);
            local_2770[3] = (RTCHitN)(char)((uint)uVar106 >> 0x18);
            local_2770[4] = (RTCHitN)(char)uVar106;
            local_2770[5] = (RTCHitN)(char)((uint)uVar106 >> 8);
            local_2770[6] = (RTCHitN)(char)((uint)uVar106 >> 0x10);
            local_2770[7] = (RTCHitN)(char)((uint)uVar106 >> 0x18);
            local_2770[8] = (RTCHitN)(char)uVar106;
            local_2770[9] = (RTCHitN)(char)((uint)uVar106 >> 8);
            local_2770[10] = (RTCHitN)(char)((uint)uVar106 >> 0x10);
            local_2770[0xb] = (RTCHitN)(char)((uint)uVar106 >> 0x18);
            local_2770[0xc] = (RTCHitN)(char)uVar106;
            local_2770[0xd] = (RTCHitN)(char)((uint)uVar106 >> 8);
            local_2770[0xe] = (RTCHitN)(char)((uint)uVar106 >> 0x10);
            local_2770[0xf] = (RTCHitN)(char)((uint)uVar106 >> 0x18);
            uStack_272c = local_2730;
            uStack_2728 = local_2730;
            uStack_2724 = local_2730;
            uStack_271c = local_2720;
            uStack_2718 = local_2720;
            uStack_2714 = local_2720;
            uStack_270c = local_2710;
            uStack_2708 = local_2710;
            uStack_2704 = local_2710;
            vpcmpeqd_avx2(ZEXT1632(local_2740),ZEXT1632(local_2740));
            uStack_26fc = context->user->instID[0];
            local_2700 = uStack_26fc;
            uStack_26f8 = uStack_26fc;
            uStack_26f4 = uStack_26fc;
            uStack_26f0 = context->user->instPrimID[0];
            uStack_26ec = uStack_26f0;
            uStack_26e8 = uStack_26f0;
            uStack_26e4 = uStack_26f0;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25a0 + uVar49);
            local_2950 = *local_2938;
            local_28d0.valid = (int *)local_2950;
            local_28d0.geometryUserPtr = pGVar10->userPtr;
            local_28d0.context = context->user;
            local_28d0.hit = local_2770;
            local_28d0.N = 4;
            local_28d0.ray = (RTCRayN *)ray;
            if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar10->intersectionFilterN)(&local_28d0);
            }
            if (local_2950 == (undefined1  [16])0x0) {
              auVar61 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar61 = auVar61 ^ _DAT_01f46b70;
            }
            else {
              p_Var13 = context->args->filter;
              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var13)(&local_28d0);
              }
              auVar66 = vpcmpeqd_avx(local_2950,_DAT_01f45a50);
              auVar61 = auVar66 ^ _DAT_01f46b70;
              if (local_2950 != (undefined1  [16])0x0) {
                auVar66 = auVar66 ^ _DAT_01f46b70;
                auVar70 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])local_28d0.hit);
                *(undefined1 (*) [16])(local_28d0.ray + 0xc0) = auVar70;
                auVar70 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])(local_28d0.hit + 0x10));
                *(undefined1 (*) [16])(local_28d0.ray + 0xd0) = auVar70;
                auVar70 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])(local_28d0.hit + 0x20));
                *(undefined1 (*) [16])(local_28d0.ray + 0xe0) = auVar70;
                auVar70 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])(local_28d0.hit + 0x30));
                *(undefined1 (*) [16])(local_28d0.ray + 0xf0) = auVar70;
                auVar70 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])(local_28d0.hit + 0x40));
                *(undefined1 (*) [16])(local_28d0.ray + 0x100) = auVar70;
                auVar70 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])(local_28d0.hit + 0x50));
                *(undefined1 (*) [16])(local_28d0.ray + 0x110) = auVar70;
                auVar70 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])(local_28d0.hit + 0x60));
                *(undefined1 (*) [16])(local_28d0.ray + 0x120) = auVar70;
                auVar70 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])(local_28d0.hit + 0x70));
                *(undefined1 (*) [16])(local_28d0.ray + 0x130) = auVar70;
                auVar66 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])(local_28d0.hit + 0x80));
                *(undefined1 (*) [16])(local_28d0.ray + 0x140) = auVar66;
              }
            }
            auVar54._8_8_ = 0x100000001;
            auVar54._0_8_ = 0x100000001;
            if ((auVar54 & auVar61) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_28a0._0_4_;
            }
            else {
              local_28a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_2880 + uVar48 * 4) = 0;
            auVar60 = ZEXT3264(local_28a0);
            uVar106 = local_28a0._0_4_;
            auVar59._4_4_ = uVar106;
            auVar59._0_4_ = uVar106;
            auVar59._8_4_ = uVar106;
            auVar59._12_4_ = uVar106;
            auVar59._16_4_ = uVar106;
            auVar59._20_4_ = uVar106;
            auVar59._24_4_ = uVar106;
            auVar59._28_4_ = uVar106;
            auVar84 = ZEXT3264(local_2860);
            auVar83 = vcmpps_avx(local_2860,auVar59,2);
            local_2880 = vandps_avx(auVar83,local_2880);
          }
          auVar88 = ZEXT3264(local_2880);
          if ((((((((local_2880 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_2880 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_2880 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_2880 >> 0x7f,0) == '\0') &&
                (local_2880 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_2880 >> 0xbf,0) == '\0') &&
              (local_2880 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_2880[0x1f]) goto LAB_016801ba;
          auVar58._8_4_ = 0x7f800000;
          auVar58._0_8_ = 0x7f8000007f800000;
          auVar58._12_4_ = 0x7f800000;
          auVar58._16_4_ = 0x7f800000;
          auVar58._20_4_ = 0x7f800000;
          auVar58._24_4_ = 0x7f800000;
          auVar58._28_4_ = 0x7f800000;
          auVar83 = vblendvps_avx(auVar58,auVar84._0_32_,local_2880);
          auVar57 = vshufps_avx(auVar83,auVar83,0xb1);
          auVar57 = vminps_avx(auVar83,auVar57);
          auVar64 = vshufpd_avx(auVar57,auVar57,5);
          auVar57 = vminps_avx(auVar57,auVar64);
          auVar64 = vpermpd_avx2(auVar57,0x4e);
          auVar57 = vminps_avx(auVar57,auVar64);
          auVar83 = vcmpps_avx(auVar83,auVar57,0);
          auVar57 = local_2880 & auVar83;
          if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar57 >> 0x7f,0) != '\0') ||
                (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar57 >> 0xbf,0) != '\0') ||
              (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar57[0x1f] < '\0') {
            auVar83 = vandps_avx(auVar83,local_2880);
            auVar88 = ZEXT3264(auVar83);
          }
          goto LAB_016803d3;
        }
      }
LAB_016801ba:
      auVar84 = ZEXT3264(local_23e0);
      auVar88 = ZEXT3264(local_2400);
      auVar93 = ZEXT3264(local_2420);
      auVar97 = ZEXT3264(local_2460);
      auVar102 = ZEXT3264(local_2480);
      auVar105 = ZEXT3264(local_24a0);
      auVar110 = ZEXT3264(local_24c0);
      uVar48 = local_2928;
      uVar49 = local_2930;
    }
    uVar106 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar60 = ZEXT3264(CONCAT428(uVar106,CONCAT424(uVar106,CONCAT420(uVar106,CONCAT416(uVar106,
                                                  CONCAT412(uVar106,CONCAT48(uVar106,CONCAT44(
                                                  uVar106,uVar106))))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }